

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableFill
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,TableFill *curr)

{
  Type type;
  Table *pTVar1;
  
  pTVar1 = Module::getTable(this->wasm,(Name)(curr->table).super_IString.str);
  type.id = (pTVar1->type).id;
  noteTableIndex(this,&curr->dest,(Name)(curr->table).super_IString.str);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->value,type);
  noteTableIndex(this,&curr->size,(Name)(curr->table).super_IString.str);
  return;
}

Assistant:

void visitTableFill(TableFill* curr) {
    auto type = wasm.getTable(curr->table)->type;
    noteTableIndex(&curr->dest, curr->table);
    note(&curr->value, type);
    noteTableIndex(&curr->size, curr->table);
  }